

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

uint32_t __thiscall fasttext::Dictionary::hash(Dictionary *this,string *str)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RSI;
  size_t i;
  uint32_t h;
  undefined8 local_20;
  undefined4 local_14;
  
  local_14 = 0x811c9dc5;
  local_20 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_20) break;
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    local_14 = (local_14 ^ (int)*pcVar2) * 0x1000193;
    local_20 = local_20 + 1;
  }
  return local_14;
}

Assistant:

uint32_t Dictionary::hash(const std::string& str) const {
  uint32_t h = 2166136261;
  for (size_t i = 0; i < str.size(); i++) {
    h = h ^ uint32_t(str[i]);
    h = h * 16777619;
  }
  return h;
}